

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastAdderCLA_rec
               (Gia_Man_t *pNew,int *pGen,int *pPro,int *pCar,int nBits,int *pGen1,int *pPro1)

{
  int *pGen1_00;
  int nBits_00;
  int pPro2 [2];
  int pGen2 [2];
  int *pCar_00;
  int local_48;
  int local_44;
  int *local_40;
  int local_38;
  int local_34;
  
  if (nBits == 2) {
    pCar_00 = pCar + 1;
    pGen1_00 = pGen;
  }
  else {
    local_40 = pGen1;
    if ((nBits & 1U) != 0) {
      __assert_fail("nBits % 2 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                    ,0x14f,
                    "void Wlc_BlastAdderCLA_rec(Gia_Man_t *, int *, int *, int *, int, int *, int *)"
                   );
    }
    nBits_00 = nBits >> 1;
    pGen1_00 = &local_38;
    Wlc_BlastAdderCLA_rec(pNew,pGen,pPro,pCar,nBits_00,pGen1_00,&local_48);
    pCar_00 = pCar + nBits_00;
    *pCar_00 = local_38;
    Wlc_BlastAdderCLA_rec(pNew,pGen + nBits_00,pPro + nBits_00,pCar_00,nBits_00,&local_34,&local_44)
    ;
    pPro = &local_48;
    pGen1 = local_40;
  }
  Wlc_BlastAdderCLA_one(pNew,pGen1_00,pPro,pCar,pGen1,pPro1,pCar_00);
  return;
}

Assistant:

void Wlc_BlastAdderCLA_rec( Gia_Man_t * pNew, int * pGen, int * pPro, int * pCar, int nBits, int * pGen1, int * pPro1 )
{
    if ( nBits == 2 )
        Wlc_BlastAdderCLA_one( pNew, pGen, pPro, pCar, pGen1, pPro1, pCar+1 ); // returns *pGen1, *pPro1, pCar[1]
    else
    {
        int pGen2[2], pPro2[2];
        assert( nBits % 2 == 0 );
        // call recursively
        Wlc_BlastAdderCLA_rec( pNew, pGen,         pPro,         pCar,         nBits/2, pGen2,   pPro2   );
        pCar[nBits/2] = *pGen2;
        Wlc_BlastAdderCLA_rec( pNew, pGen+nBits/2, pPro+nBits/2, pCar+nBits/2, nBits/2, pGen2+1, pPro2+1 );
        // create structure
        Wlc_BlastAdderCLA_one( pNew, pGen2, pPro2, pCar, pGen1, pPro1, pCar+nBits/2 ); // returns *pGen1, *pPro1, pCar[nBits/2]
    }
}